

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int enc_row_mt_worker_hook(void *arg1,void *unused)

{
  byte bVar1;
  undefined4 uVar2;
  long lVar3;
  _Bool _Var4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  TileDataEnc *tile_data;
  long lVar9;
  PC_TREE *pPVar10;
  ThreadData_conflict *pTVar11;
  CommonContexts *above_contexts;
  long *in_RDI;
  int sb_row;
  ThreadData_conflict *td;
  int tile_col;
  int tile_row;
  TileInfo *tile_info;
  AV1EncRowMultiThreadSync *row_mt_sync;
  TileDataEnc *this_tile;
  int current_mi_row;
  _Bool row_mt_exit;
  int end_of_frame;
  BLOCK_SIZE fp_block_size;
  int cur_tile_id;
  int mib_size_log2;
  _Bool do_pipelined_lpf_mt_with_enc;
  AV1_COMMON *cm;
  MACROBLOCKD *xd;
  AV1LfSync *lf_sync;
  aom_internal_error_info *error_info;
  pthread_mutex_t *enc_row_mt_mutex_;
  AV1EncRowMultiThreadInfo *enc_row_mt;
  int thread_id;
  AV1_COMP *cpi;
  EncWorkerData *thread_data;
  uint in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  CFL_CTX *in_stack_ffffffffffffff40;
  AV1LfSync *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  long lVar12;
  int tile_col_00;
  ThreadData_conflict *pTVar13;
  AV1_COMP *cpi_00;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int iVar14;
  int *end_of_frame_00;
  long *current_mi_row_00;
  pthread_mutex_t *__mutex;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar15;
  int local_4;
  
  lVar3 = *in_RDI;
  iVar15 = *(int *)((long)in_RDI + 0x1cc);
  tile_data = (TileDataEnc *)(lVar3 + 0x9ae98);
  __mutex = *(pthread_mutex_t **)(lVar3 + 0x9afb8);
  current_mi_row_00 = in_RDI + 3;
  end_of_frame_00 = (int *)in_RDI[0x37];
  lVar9 = in_RDI[1] + 0x1a0;
  *(long **)(in_RDI[1] + 0x2b90) = current_mi_row_00;
  _Var4 = lpf_mt_with_enc_enabled(*(int *)(lVar3 + 0x9d1e8),(int *)(lVar3 + 0x41970));
  iVar6 = _setjmp((__jmp_buf_tag *)(current_mi_row_00 + 0x1b));
  if (iVar6 == 0) {
    *(undefined4 *)(current_mi_row_00 + 0x1a) = 1;
    uVar2 = *(undefined4 *)(*(long *)(lVar3 + 0x42008) + 0x24);
    iVar6 = *(int *)((long)((tile_data->tctx).txb_skip_cdf + -1) + 0x3e + (long)iVar15 * 4);
    if (*(int *)(lVar3 + 0x60cb0) == 0) {
      *(undefined8 *)(in_RDI[1] + 0x26e50) = 0;
    }
    else {
      pPVar10 = av1_alloc_pc_tree_node((BLOCK_SIZE)((uint)in_stack_ffffffffffffff3c >> 0x18));
      *(PC_TREE **)(in_RDI[1] + 0x26e50) = pPVar10;
      if (*(long *)(in_RDI[1] + 0x26e50) == 0) {
        aom_internal_error(*(aom_internal_error_info **)(lVar9 + 0x29f0),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PC_TREE");
      }
    }
    bVar1 = *(byte *)(lVar3 + 0x9d514);
    *(undefined8 *)(in_RDI[1] + 0x2b38) = *(undefined8 *)(lVar3 + 0x42010);
    while( true ) {
      iVar14 = -1;
      pthread_mutex_lock(__mutex);
      bVar5 = (byte)(tile_data->tctx).txb_skip_cdf[3][3][0] & 1;
      if ((bVar5 == 0) &&
         (iVar7 = get_next_job((TileDataEnc *)(*(long *)(lVar3 + 0x71318) + (long)iVar6 * 0x5d10),
                               (int *)&stack0xffffffffffffff84,
                               *(int *)(*(long *)(lVar3 + 0x42008) + 0x20)), iVar7 == 0)) {
        in_stack_ffffffffffffff38 = (uint)bVar1;
        switch_tile_and_get_next_job
                  ((AV1_COMMON *)CONCAT44(iVar15,in_stack_ffffffffffffffd0),tile_data,
                   (int *)__mutex->__size,(int *)current_mi_row_00,end_of_frame_00,
                   (int)((ulong)lVar9 >> 0x20),(BLOCK_SIZE)in_RDI);
      }
      pthread_mutex_unlock(__mutex);
      if (bVar5 != 0) break;
      pTVar11 = (ThreadData_conflict *)(*(long *)(lVar3 + 0x71318) + (long)iVar6 * 0x5d10);
      cpi_00 = (AV1_COMP *)((pTVar11->mb).mode_costs.y_mode_costs[8][7] + 0xb);
      iVar7 = *(int *)&(pTVar11->mb).plane[0].qcoeff;
      tile_col_00 = *(int *)((long)&(pTVar11->mb).plane[0].qcoeff + 4);
      lVar12 = in_RDI[1];
      iVar8 = iVar14 >> ((byte)uVar2 & 0x1f);
      *(undefined8 *)(lVar12 + 0x2b38) = *(undefined8 *)(lVar12 + 0x25d70);
      *(uint16_t ***)(lVar12 + 0x4188) = &(pTVar11->mb).plane[0].eobs;
      *(undefined8 *)(lVar12 + 0x25d30) = 0;
      pTVar13 = pTVar11;
      if ((char)(pTVar11->mb).mode_costs.y_mode_costs[4][0xc][4] == '\0') {
        memcpy(*(void **)(lVar12 + 0x2b38),&(pTVar11->mb).plane[0].eobs,0x52fc);
      }
      else {
        *(undefined8 *)(lVar12 + 0x4180) =
             *(undefined8 *)(pTVar11->mb).mode_costs.y_mode_costs[4][0xc];
        if (iVar14 == *(int *)&(pTVar11->mb).plane[0].src_diff) {
          memcpy(*(void **)(lVar12 + 0x2b38),&(pTVar11->mb).plane[0].eobs,0x52fc);
        }
      }
      above_contexts = (CommonContexts *)(lVar3 + 0x42278);
      iVar14 = av1_num_planes((AV1_COMMON *)(lVar3 + 0x3bf80));
      av1_init_above_context(above_contexts,iVar14,iVar7,(MACROBLOCKD *)(lVar12 + 0x1a0));
      cfl_init(in_stack_ffffffffffffff40,
               (SequenceHeader *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (*(long *)(lVar12 + 0x25610) != 0) {
        av1_crc32c_calculator_init((CRC32C *)(*(long *)(lVar12 + 0x25610) + 0x4248));
      }
      av1_encode_sb_row(cpi_00,pTVar13,iVar7,tile_col_00,(int)((ulong)lVar12 >> 0x20));
      pthread_mutex_lock(__mutex);
      *(long *)((pTVar11->mb).mode_costs.y_mode_costs[4][0xc] + 2) =
           *(long *)(lVar12 + 0x25d30) +
           *(long *)((pTVar11->mb).mode_costs.y_mode_costs[4][0xc] + 2);
      *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[1] + 4) =
           *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[1] + 4) + -1;
      lVar12 = *(long *)((tile_data->tctx).txb_skip_cdf[3] + 1);
      *(int *)(lVar12 + (long)iVar8 * 4) = *(int *)(lVar12 + (long)iVar8 * 4) + 1;
      pthread_cond_broadcast(*(pthread_cond_t **)((tile_data->tctx).txb_skip_cdf[3] + 5));
      pthread_mutex_unlock(__mutex);
    }
    *(undefined4 *)(current_mi_row_00 + 0x1a) = 0;
    local_4 = 1;
  }
  else {
    *(undefined4 *)(current_mi_row_00 + 0x1a) = 0;
    pthread_mutex_lock(__mutex);
    iVar15 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
    *(undefined1 *)(tile_data->tctx).txb_skip_cdf[3][3] = 1;
    pthread_cond_broadcast(*(pthread_cond_t **)((tile_data->tctx).txb_skip_cdf[3] + 5));
    pthread_mutex_unlock(__mutex);
    set_encoding_done((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if (_Var4) {
      pthread_mutex_lock(*(pthread_mutex_t **)(end_of_frame_00 + 0x18));
      *(undefined1 *)(end_of_frame_00 + 0x1e) = 1;
      pthread_mutex_unlock(*(pthread_mutex_t **)(end_of_frame_00 + 0x18));
      av1_set_vert_loop_filter_done
                ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48,iVar15);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int enc_row_mt_worker_hook(void *arg1, void *unused) {
  EncWorkerData *const thread_data = (EncWorkerData *)arg1;
  AV1_COMP *const cpi = thread_data->cpi;
  int thread_id = thread_data->thread_id;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *enc_row_mt_mutex_ = enc_row_mt->mutex_;
#endif
  (void)unused;

  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  AV1LfSync *const lf_sync = thread_data->lf_sync;
  MACROBLOCKD *const xd = &thread_data->td->mb.e_mbd;
  xd->error_info = error_info;
  AV1_COMMON *volatile const cm = &cpi->common;
  volatile const bool do_pipelined_lpf_mt_with_enc = lpf_mt_with_enc_enabled(
      cpi->mt_info.pipeline_lpf_mt_with_enc, cm->lf.filter_level);

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
    enc_row_mt->row_mt_exit = true;
    // Wake up all the workers waiting in launch_loop_filter_rows() to exit in
    // case of an error.
    pthread_cond_broadcast(enc_row_mt->cond_);
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
    set_encoding_done(cpi);

    if (do_pipelined_lpf_mt_with_enc) {
#if CONFIG_MULTITHREAD
      pthread_mutex_lock(lf_sync->job_mutex);
      lf_sync->lf_mt_exit = true;
      pthread_mutex_unlock(lf_sync->job_mutex);
#endif
      av1_set_vert_loop_filter_done(&cpi->common, lf_sync,
                                    cpi->common.seq_params->mib_size_log2);
    }
    return 0;
  }
  error_info->setjmp = 1;

  const int mib_size_log2 = cm->seq_params->mib_size_log2;
  int cur_tile_id = enc_row_mt->thread_id_to_tile_id[thread_id];

  // Preallocate the pc_tree for realtime coding to reduce the cost of memory
  // allocation.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode) {
    thread_data->td->pc_root = av1_alloc_pc_tree_node(cm->seq_params->sb_size);
    if (!thread_data->td->pc_root)
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
  } else {
    thread_data->td->pc_root = NULL;
  }

  assert(cur_tile_id != -1);

  const BLOCK_SIZE fp_block_size = cpi->fp_block_size;
  int end_of_frame = 0;
  bool row_mt_exit = false;

  // When master thread does not have a valid job to process, xd->tile_ctx
  // is not set and it contains NULL pointer. This can result in NULL pointer
  // access violation if accessed beyond the encode stage. Hence, updating
  // thread_data->td->mb.e_mbd.tile_ctx is initialized with common frame
  // context to avoid NULL pointer access in subsequent stages.
  thread_data->td->mb.e_mbd.tile_ctx = cm->fc;
  while (1) {
    int current_mi_row = -1;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
#endif
    row_mt_exit = enc_row_mt->row_mt_exit;
    // row_mt_exit check here can be avoided as it is checked after
    // sync_read_ptr() in encode_sb_row(). However, checking row_mt_exit here,
    // tries to return before calling the function get_next_job().
    if (!row_mt_exit &&
        !get_next_job(&cpi->tile_data[cur_tile_id], &current_mi_row,
                      cm->seq_params->mib_size)) {
      // No jobs are available for the current tile. Query for the status of
      // other tiles and get the next job if available
      switch_tile_and_get_next_job(cm, cpi->tile_data, &cur_tile_id,
                                   &current_mi_row, &end_of_frame, 0,
                                   fp_block_size);
    }
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
    // When row_mt_exit is set to true, other workers need not pursue any
    // further jobs.
    if (row_mt_exit) {
      error_info->setjmp = 0;
      return 1;
    }

    if (end_of_frame) break;

    TileDataEnc *const this_tile = &cpi->tile_data[cur_tile_id];
    AV1EncRowMultiThreadSync *const row_mt_sync = &this_tile->row_mt_sync;
    const TileInfo *const tile_info = &this_tile->tile_info;
    const int tile_row = tile_info->tile_row;
    const int tile_col = tile_info->tile_col;
    ThreadData *td = thread_data->td;
    const int sb_row = current_mi_row >> mib_size_log2;

    assert(current_mi_row != -1 && current_mi_row <= tile_info->mi_row_end);

    td->mb.e_mbd.tile_ctx = td->tctx;
    td->mb.tile_pb_ctx = &this_tile->tctx;
    td->abs_sum_level = 0;

    if (this_tile->allow_update_cdf) {
      td->mb.row_ctx = this_tile->row_ctx;
      if (current_mi_row == tile_info->mi_row_start)
        memcpy(td->mb.e_mbd.tile_ctx, &this_tile->tctx, sizeof(FRAME_CONTEXT));
    } else {
      memcpy(td->mb.e_mbd.tile_ctx, &this_tile->tctx, sizeof(FRAME_CONTEXT));
    }

    av1_init_above_context(&cm->above_contexts, av1_num_planes(cm), tile_row,
                           &td->mb.e_mbd);
#if !CONFIG_REALTIME_ONLY
    cfl_init(&td->mb.e_mbd.cfl, cm->seq_params);
#endif
    if (td->mb.txfm_search_info.mb_rd_record != NULL) {
      av1_crc32c_calculator_init(
          &td->mb.txfm_search_info.mb_rd_record->crc_calculator);
    }

    av1_encode_sb_row(cpi, td, tile_row, tile_col, current_mi_row);
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
#endif
    this_tile->abs_sum_level += td->abs_sum_level;
    row_mt_sync->num_threads_working--;
    enc_row_mt->num_tile_cols_done[sb_row]++;
#if CONFIG_MULTITHREAD
    pthread_cond_broadcast(enc_row_mt->cond_);
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
  }
  if (do_pipelined_lpf_mt_with_enc) {
    // Loop-filter a superblock row if encoding of the current and next
    // superblock row is complete.
    // TODO(deepa.kg @ittiam.com) Evaluate encoder speed by interleaving
    // encoding and loop filter stage.
    launch_loop_filter_rows(cm, thread_data, enc_row_mt, mib_size_log2);
  }
  av1_free_pc_tree_recursive(thread_data->td->pc_root, av1_num_planes(cm), 0, 0,
                             cpi->sf.part_sf.partition_search_type);
  thread_data->td->pc_root = NULL;
  error_info->setjmp = 0;
  return 1;
}